

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O0

SUNErrCode SUNMatScaleAdd_Dense(sunrealtype c,SUNMatrix A,SUNMatrix B)

{
  sunindextype j;
  sunindextype i;
  SUNContext sunctx_local_scope_;
  SUNMatrix B_local;
  SUNMatrix A_local;
  sunrealtype c_local;
  
  for (j = 0; j < *(long *)((long)A->content + 8); j = j + 1) {
    for (i = 0; i < *A->content; i = i + 1) {
      *(double *)(*(long *)(*(long *)((long)A->content + 0x20) + j * 8) + i * 8) =
           c * *(double *)(*(long *)(*(long *)((long)A->content + 0x20) + j * 8) + i * 8) +
           *(double *)(*(long *)(*(long *)((long)B->content + 0x20) + j * 8) + i * 8);
    }
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatScaleAdd_Dense(sunrealtype c, SUNMatrix A, SUNMatrix B)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j;

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_DENSE, SUN_ERR_ARG_WRONGTYPE);
  SUNCheck(compatibleMatrices(A, B), SUN_ERR_ARG_DIMSMISMATCH);

  /* Perform operation A = c*A + B */
  for (j = 0; j < SM_COLUMNS_D(A); j++)
  {
    for (i = 0; i < SM_ROWS_D(A); i++)
    {
      SM_ELEMENT_D(A, i, j) = c * SM_ELEMENT_D(A, i, j) + SM_ELEMENT_D(B, i, j);
    }
  }

  return SUN_SUCCESS;
}